

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintInt64
          (FastFieldValuePrinter *this,int64 val,BaseTextGenerator *generator)

{
  char *pcVar1;
  char local_60 [32];
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  pcVar1 = FastInt64ToBufferLeft(val,local_60);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,local_60,pcVar1);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintInt64(
    int64 val, BaseTextGenerator* generator) const {
  generator->PrintString(StrCat(val));
}